

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_electronVolt_Test::TestBody(unitStrings_electronVolt_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t in_RCX;
  uint64_t uVar4;
  string *psVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  pointer *__ptr;
  char *pcVar7;
  string str;
  precise_unit local_88;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  precise_unit local_38;
  
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)units::precise::energy::eV,ppVar3,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)local_78,"to_string(precise::energy::eV)","\"eV\"",&local_58,
             (char (*) [3])0x1fb1bc);
  paVar1 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x188,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::nano + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  uVar4 = 0x3a296333573896a3;
  local_88.multiplier_ = 1.602176634e-28;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_58;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_88,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::nano * precise::energy::eV)","\"neV\"",psVar5,
             (char (*) [4])"neV");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    psVar5 = (string *)0x189;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x189,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::micro + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  local_88.multiplier_ = 1.602176634e-25;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  psVar6 = &local_58;
  units::to_string_abi_cxx11_(psVar6,(units *)&local_88,ppVar3,(uint64_t)psVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::micro * precise::energy::eV)","\"ueV\"",psVar6
             ,(char (*) [4])0x1fb1af);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    psVar6 = (string *)0x18a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::milli + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  local_88.multiplier_ = (double)&DAT_3b68361ee25a3388;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)&local_88,ppVar3,(uint64_t)psVar6);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::milli * precise::energy::eV)","\"meV\"",
             &local_58,(char (*) [4])0x1fb1a1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::kilo + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  uVar4 = 0x3ca716fd0c15cdcd;
  local_88.multiplier_ = 1.602176634e-16;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)&local_88,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::kilo * precise::energy::eV)","\"keV\"",
             &local_58,(char (*) [4])"keV");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::mega + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  uVar4 = 0x3d468c731dcd4afa;
  local_88.multiplier_ = 1.6021766339999998e-13;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)&local_88,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::mega * precise::energy::eV)","\"MeV\"",
             &local_58,(char (*) [4])"MeV");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::giga + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  uVar4 = 0x3de605286b1a7b38;
  local_88.multiplier_ = 1.6021766339999998e-10;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_58,(units *)&local_88,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::giga * precise::energy::eV)","\"GeV\"",
             &local_58,(char (*) [4])"GeV");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x18e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::tera + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  uVar4 = 0x3e8581097897dc55;
  local_88.multiplier_ = 1.602176634e-07;
  local_88.commodity_ = 0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  psVar5 = &local_58;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_88,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_78,"to_string(precise::tera * precise::energy::eV)","\"TeV\"",psVar5,
             (char (*) [4])"TeV");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_70->_M_dataplus)._M_p;
    }
    psVar5 = (string *)0x18f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,399,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::milli + 8),
                  (unit_data *)(units::precise::energy::eV + 8));
  local_88.multiplier_ = (double)&DAT_3b68361ee25a3388;
  local_88.commodity_ = 0;
  _local_78 = units::precise_unit::operator/((precise_unit *)units::precise::count,&local_88);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  psVar6 = &local_58;
  units::to_string_abi_cxx11_(psVar6,(units *)local_78,ppVar3,(uint64_t)psVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)local_78,"str","\"count/meV\"",psVar6,(char (*) [10])"count/meV");
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    psVar6 = (string *)0x193;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x193,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_88.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_88.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::micro + 8),
                     (unit_data *)(units::precise::energy::eV + 8));
  local_38._8_8_ = ZEXT48((uint)uVar2);
  local_38.multiplier_ = 1.602176634e-25;
  local_88 = units::precise_unit::operator/((precise_unit *)units::precise::one,&local_38);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_78,(units *)&local_88,ppVar3,(uint64_t)psVar6);
  std::__cxx11::string::operator=((string *)&local_58,(string *)local_78);
  if (local_78 != (undefined1  [8])&local_68) {
    operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
  }
  lhs = &local_58;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)local_78,"str","\"1/ueV\"",lhs,(char (*) [6])"1/ueV");
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x196;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x196,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_88.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_88.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  local_88 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::m,(precise_unit *)units::precise::energy::eV
                       );
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_78,(units *)&local_88,ppVar3,(uint64_t)lhs);
  std::__cxx11::string::operator=((string *)&local_58,(string *)local_78);
  if (local_78 != (undefined1  [8])&local_68) {
    operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_78,"str","\"m/eV\"",&local_58,(char (*) [5])"m/eV");
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_70;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x199,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((long *)local_88.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_88.multiplier_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(unitStrings, electronVolt)
{
    EXPECT_EQ(to_string(precise::energy::eV), "eV");
    EXPECT_EQ(to_string(precise::nano * precise::energy::eV), "neV");
    EXPECT_EQ(to_string(precise::micro * precise::energy::eV), "ueV");
    EXPECT_EQ(to_string(precise::milli * precise::energy::eV), "meV");
    EXPECT_EQ(to_string(precise::kilo * precise::energy::eV), "keV");
    EXPECT_EQ(to_string(precise::mega * precise::energy::eV), "MeV");
    EXPECT_EQ(to_string(precise::giga * precise::energy::eV), "GeV");
    EXPECT_EQ(to_string(precise::tera * precise::energy::eV), "TeV");

    auto str =
        to_string(precise::count / (precise::milli * precise::energy::eV));
    EXPECT_EQ(str, "count/meV");

    str = to_string(precise::one / (precise::micro * precise::energy::eV));
    EXPECT_EQ(str, "1/ueV");

    str = to_string(precise::m / precise::energy::eV);
    EXPECT_EQ(str, "m/eV");
}